

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

U32 * COVER_map_at(COVER_map_t *map,U32 key)

{
  COVER_map_pair_t *pCVar1;
  ulong uVar2;
  U32 *pUVar3;
  COVER_map_pair_t *pCVar4;
  
  uVar2 = (ulong)(key * -0x61c8864f >> (-(char)map->sizeLog & 0x1fU));
  pCVar1 = map->data;
  if (pCVar1[uVar2].value != 0xffffffff) {
    pCVar4 = pCVar1 + uVar2;
    do {
      if (pCVar4->key == key) {
        return &pCVar1[uVar2].value;
      }
      uVar2 = (ulong)((int)uVar2 + 1U & map->sizeMask);
      pCVar4 = pCVar1 + uVar2;
    } while (pCVar4->value != 0xffffffff);
  }
  pUVar3 = &pCVar1[uVar2].value;
  pCVar1[uVar2].key = key;
  *pUVar3 = 0;
  return pUVar3;
}

Assistant:

static U32 *COVER_map_at(COVER_map_t *map, U32 key) {
  COVER_map_pair_t *pos = &map->data[COVER_map_index(map, key)];
  if (pos->value == MAP_EMPTY_VALUE) {
    pos->key = key;
    pos->value = 0;
  }
  return &pos->value;
}